

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

llama_sampler * llama_sampler_dist_clone(llama_sampler *smpl)

{
  uint32_t *puVar1;
  llama_sampler *plVar2;
  
  puVar1 = (uint32_t *)smpl->ctx;
  plVar2 = llama_sampler_init_dist(*puVar1);
  memcpy((void *)((long)plVar2->ctx + 8),puVar1 + 2,5000);
  return plVar2;
}

Assistant:

static struct llama_sampler * llama_sampler_dist_clone(const struct llama_sampler * smpl) {
    const auto * ctx = (const llama_sampler_dist *) smpl->ctx;
    auto * result = llama_sampler_init_dist(ctx->seed);

    // copy the state
    {
        auto * result_ctx = (llama_sampler_dist *) result->ctx;

        result_ctx->rng = ctx->rng;
    }

    return result;
}